

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

char_t * __thiscall
pugi::impl::anon_unknown_0::xml_parser::parse_doctype_group(xml_parser *this,char_t *s,char_t endch)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  byte *pbVar4;
  long lVar5;
  long lVar6;
  
  lVar5 = 0;
  pbVar4 = (byte *)(s + 2);
LAB_00161e11:
  do {
    bVar1 = *pbVar4;
    if (bVar1 < 0x27) {
      if (bVar1 != 0x22) {
        if (bVar1 == 0) {
          if (endch != '>' || lVar5 != 0) {
            this->error_offset = (char_t *)pbVar4;
            this->error_status = status_bad_doctype;
            return (char_t *)0x0;
          }
          return (char_t *)pbVar4;
        }
LAB_00161f1a:
        pbVar4 = pbVar4 + 1;
        goto LAB_00161e11;
      }
LAB_00161eb2:
      pbVar3 = pbVar4 + 1;
      do {
        pbVar4 = pbVar3;
        bVar2 = *pbVar4;
        pbVar3 = pbVar4 + 1;
        if (bVar2 == 0) break;
      } while (bVar2 != bVar1);
      if (bVar2 == 0) goto LAB_00161f26;
    }
    else {
      if (bVar1 == 0x27) goto LAB_00161eb2;
      if (bVar1 != 0x3c) {
        if (bVar1 == 0x3e) {
          if (lVar5 == 0) {
            return (char_t *)pbVar4;
          }
          lVar5 = lVar5 + -1;
        }
        goto LAB_00161f1a;
      }
      if ((pbVar4[1] == 0x21) && (pbVar4[2] != 0x2d)) {
        if (pbVar4[2] == 0x5b) {
          pbVar3 = pbVar4 + 3;
          lVar6 = 0;
LAB_00161e58:
          pbVar3 = pbVar3 + 3;
          do {
            bVar1 = pbVar3[-3];
            if (bVar1 == 0x3c) {
              if ((pbVar3[-2] == 0x21) && (pbVar3[-1] == 0x5b)) {
                lVar6 = lVar6 + 1;
                goto LAB_00161e58;
              }
            }
            else if (bVar1 == 0x5d) {
              if ((pbVar3[-2] == 0x5d) && (pbVar3[-1] == 0x3e)) goto LAB_00161e9a;
            }
            else if (bVar1 == 0) {
              pbVar4 = pbVar3 + -3;
              goto LAB_00161f26;
            }
            pbVar3 = pbVar3 + 1;
          } while( true );
        }
        pbVar4 = pbVar4 + 2;
        lVar5 = lVar5 + 1;
        goto LAB_00161e11;
      }
      if (pbVar4[1] == 0x3f) {
        pbVar4 = pbVar4 + 2;
        do {
          if (*pbVar4 == 0x3f) {
            if (pbVar4[1] == 0x3e) {
              pbVar3 = pbVar4 + 2;
              goto LAB_00161f33;
            }
          }
          else if (*pbVar4 == 0) goto LAB_00161f26;
          pbVar4 = pbVar4 + 1;
        } while( true );
      }
      if (((pbVar4[1] == 0x21) && (pbVar4[2] == 0x2d)) && (pbVar4[3] == 0x2d)) {
        pbVar4 = pbVar4 + 4;
        do {
          if (*pbVar4 == 0x2d) {
            if ((pbVar4[1] == 0x2d) && (pbVar4[2] == 0x3e)) {
              pbVar3 = pbVar4 + 3;
              goto LAB_00161f33;
            }
          }
          else if (*pbVar4 == 0) break;
          pbVar4 = pbVar4 + 1;
        } while( true );
      }
LAB_00161f26:
      this->error_offset = (char_t *)pbVar4;
      this->error_status = status_bad_doctype;
      pbVar3 = (byte *)0x0;
    }
LAB_00161f33:
    pbVar4 = pbVar3;
    if (pbVar3 == (byte *)0x0) {
      return (char_t *)0x0;
    }
  } while( true );
LAB_00161e9a:
  if (lVar6 != 0) {
    lVar6 = lVar6 + -1;
    goto LAB_00161e58;
  }
  goto LAB_00161f33;
}

Assistant:

char_t* parse_doctype_group(char_t* s, char_t endch)
		{
			size_t depth = 0;

			assert((s[0] == '<' || s[0] == 0) && s[1] == '!');
			s += 2;

			while (*s)
			{
				if (s[0] == '<' && s[1] == '!' && s[2] != '-')
				{
					if (s[2] == '[')
					{
						// ignore
						s = parse_doctype_ignore(s);
						if (!s) return s;
					}
					else
					{
						// some control group
						s += 2;
						depth++;
					}
				}
				else if (s[0] == '<' || s[0] == '"' || s[0] == '\'')
				{
					// unknown tag (forbidden), or some primitive group
					s = parse_doctype_primitive(s);
					if (!s) return s;
				}
				else if (*s == '>')
				{
					if (depth == 0)
						return s;

					depth--;
					s++;
				}
				else s++;
			}

			if (depth != 0 || endch != '>') PUGI_IMPL_THROW_ERROR(status_bad_doctype, s);

			return s;
		}